

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O0

optional_idx __thiscall
duckdb::FunctionBinder::BindFunctionCost
          (FunctionBinder *this,SimpleFunction *func,vector<duckdb::LogicalType,_true> *arguments)

{
  bool bVar1;
  LogicalTypeId LVar2;
  LogicalType *source;
  LogicalType *pLVar3;
  LogicalType *pLVar4;
  const_reference this_00;
  int64_t iVar5;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_RDX;
  long in_RSI;
  CastFunctionSet *in_RDI;
  int64_t cast_cost;
  idx_t i;
  FunctionBinder *in_stack_00000038;
  bool has_parameter;
  idx_t cost;
  CastFunctionSet *in_stack_ffffffffffffff98;
  const_reference in_stack_ffffffffffffffa0;
  LogicalType *local_38;
  idx_t index;
  optional_idx local_8;
  
  bVar1 = SimpleFunction::HasVarArgs((SimpleFunction *)0x2a54f87);
  if (bVar1) {
    local_8 = BindVarArgsFunctionCost
                        (in_stack_00000038,i,(vector<duckdb::LogicalType,_true> *)cast_cost);
  }
  else {
    source = (LogicalType *)
             ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                       ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                        (in_RSI + 0x48));
    pLVar3 = (LogicalType *)
             ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size(in_RDX);
    if (source == pLVar3) {
      index = 0;
      bVar1 = false;
      local_38 = (LogicalType *)0x0;
      while (pLVar3 = local_38,
            pLVar4 = (LogicalType *)
                     ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                               (in_RDX), pLVar3 < pLVar4) {
        this_00 = vector<duckdb::LogicalType,_true>::operator[]
                            ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffffa0,
                             (size_type)in_stack_ffffffffffffff98);
        LVar2 = LogicalType::id(this_00);
        if (LVar2 == UNKNOWN) {
          bVar1 = true;
        }
        else {
          in_stack_ffffffffffffff98 = CastFunctionSet::Get((ClientContext *)0x2a55050);
          in_stack_ffffffffffffffa0 =
               vector<duckdb::LogicalType,_true>::operator[]
                         ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffffa0,
                          (size_type)in_stack_ffffffffffffff98);
          vector<duckdb::LogicalType,_true>::operator[]
                    ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffffa0,
                     (size_type)in_stack_ffffffffffffff98);
          iVar5 = CastFunctionSet::ImplicitCastCost(in_RDI,source,pLVar3);
          if (iVar5 < 0) {
            optional_idx::optional_idx(&local_8);
            return (optional_idx)local_8.index;
          }
          index = iVar5 + index;
        }
        local_38 = (LogicalType *)&local_38->physical_type_;
      }
      if (bVar1) {
        optional_idx::optional_idx((optional_idx *)in_RDX,index);
      }
      else {
        optional_idx::optional_idx((optional_idx *)in_RDX,index);
      }
    }
    else {
      optional_idx::optional_idx(&local_8);
    }
  }
  return (optional_idx)local_8.index;
}

Assistant:

optional_idx FunctionBinder::BindFunctionCost(const SimpleFunction &func, const vector<LogicalType> &arguments) {
	if (func.HasVarArgs()) {
		// special case varargs function
		return BindVarArgsFunctionCost(func, arguments);
	}
	if (func.arguments.size() != arguments.size()) {
		// invalid argument count: check the next function
		return optional_idx();
	}
	idx_t cost = 0;
	bool has_parameter = false;
	for (idx_t i = 0; i < arguments.size(); i++) {
		if (arguments[i].id() == LogicalTypeId::UNKNOWN) {
			has_parameter = true;
			continue;
		}
		int64_t cast_cost = CastFunctionSet::Get(context).ImplicitCastCost(arguments[i], func.arguments[i]);
		if (cast_cost >= 0) {
			// we can implicitly cast, add the cost to the total cost
			cost += idx_t(cast_cost);
		} else {
			// we can't implicitly cast: throw an error
			return optional_idx();
		}
	}
	if (has_parameter) {
		// all arguments are implicitly castable and there is a parameter - return 0 as cost
		return 0;
	}
	return cost;
}